

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_reallocstack(lua_State *L,int newsize)

{
  StkId block;
  UpVal *pUVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  CallInfo **ppCVar4;
  int *piVar5;
  anon_union_16_2_5131162a_for_u *paVar6;
  long lVar7;
  long lVar8;
  
  block = L->stack;
  lVar7 = (long)L->stacksize;
  lVar8 = (long)newsize;
  pTVar3 = (StkId)luaM_realloc_(L,block,lVar7 * 0x10,lVar8 * 0x10);
  L->stack = pTVar3;
  piVar5 = &pTVar3[lVar7].tt_;
  for (; lVar7 < lVar8; lVar7 = lVar7 + 1) {
    *piVar5 = 0;
    piVar5 = piVar5 + 4;
  }
  L->stacksize = newsize;
  L->stack_last = pTVar3 + lVar8 + -5;
  L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar3);
  paVar6 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  while (pUVar1 = (paVar6->open).next, pUVar1 != (UpVal *)0x0) {
    pUVar1->v = (TValue *)(((long)pUVar1->v - (long)block) + (long)pTVar3);
    paVar6 = &pUVar1->u;
  }
  ppCVar4 = &L->ci;
  while (pCVar2 = *ppCVar4, pCVar2 != (CallInfo *)0x0) {
    pTVar3 = L->stack;
    pCVar2->top = (StkId)(((long)pCVar2->top - (long)block) + (long)pTVar3);
    pCVar2->func = (StkId)(((long)pCVar2->func - (long)block) + (long)pTVar3);
    if ((pCVar2->callstatus & 2) != 0) {
      (pCVar2->u).l.base = (StkId)((long)pTVar3 + ((long)(pCVar2->u).l.base - (long)block));
    }
    ppCVar4 = &pCVar2->previous;
  }
  return;
}

Assistant:

void luaD_reallocstack (lua_State *L, int newsize) {
  TValue *oldstack = L->stack;
  int lim = L->stacksize;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  luaM_reallocvector(L, L->stack, L->stacksize, newsize, TValue);
  for (; lim < newsize; lim++)
    setnilvalue(L->stack + lim); /* erase new segment */
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  correctstack(L, oldstack);
}